

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator-
          (TPZFMatrix<Fad<float>_> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,
          Fad<float> *val)

{
  FadExpr<FadUnaryMin<Fad<float>_>_> local_40;
  Fad<float> local_38;
  
  local_40.fadexpr_.expr_ = (FadUnaryMin<Fad<float>_>)(FadUnaryMin<Fad<float>_>)val;
  Fad<float>::Fad<FadUnaryMin<Fad<float>>>(&local_38,&local_40);
  operator+(__return_storage_ptr__,this,&local_38);
  Fad<float>::~Fad(&local_38);
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator-  (const TVar val ) const {
    return operator+( -val );
}